

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * sqlite3PcacheFetchFinish(PCache *pCache,Pgno pgno,sqlite3_pcache_page *pPage)

{
  PgHdr *pPgHdr;
  sqlite3_pcache_page *pPage_local;
  Pgno pgno_local;
  PCache *pCache_local;
  
  pCache_local = (PCache *)pPage->pExtra;
  if (pCache_local->pDirty == (PgHdr *)0x0) {
    pCache_local = (PCache *)pcacheFetchFinishWithInit(pCache,pgno,pPage);
  }
  else {
    pCache->nRefSum = pCache->nRefSum + 1;
    *(short *)((long)&pCache_local->xStress + 6) = *(short *)((long)&pCache_local->xStress + 6) + 1;
  }
  return (PgHdr *)pCache_local;
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheFetchFinish(
  PCache *pCache,             /* Obtain the page from this cache */
  Pgno pgno,                  /* Page number obtained */
  sqlite3_pcache_page *pPage  /* Page obtained by prior PcacheFetch() call */
){
  PgHdr *pPgHdr;

  assert( pPage!=0 );
  pPgHdr = (PgHdr *)pPage->pExtra;

  if( !pPgHdr->pPage ){
    return pcacheFetchFinishWithInit(pCache, pgno, pPage);
  }
  pCache->nRefSum++;
  pPgHdr->nRef++;
  assert( sqlite3PcachePageSanity(pPgHdr) );
  return pPgHdr;
}